

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufferGrow(xmlBufferPtr buf,uint len)

{
  uint uVar1;
  int iVar2;
  xmlChar *__dest;
  uint uVar3;
  
  if (buf == (xmlBufferPtr)0x0) {
    return -1;
  }
  uVar3 = buf->use;
  uVar1 = buf->size;
  iVar2 = 0;
  if (uVar1 - uVar3 <= len) {
    if (len < (uVar3 ^ 0x7fffffff)) {
      if (len < uVar1) {
        uVar3 = 0x7fffffff;
        if (uVar1 < 0x40000000) {
          uVar3 = uVar1 * 2;
        }
      }
      else {
        uVar1 = uVar3 + len + 1;
        uVar3 = uVar3 + 0x65 + len;
        if (0x7fffff9b < uVar1) {
          uVar3 = uVar1;
        }
      }
      if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->content != buf->contentIO)) {
        __dest = (xmlChar *)(*xmlMalloc)((size_t)uVar3);
        if (__dest == (xmlChar *)0x0) {
          return -1;
        }
        if (buf->content != (xmlChar *)0x0) {
          memcpy(__dest,buf->content,(ulong)(buf->use + 1));
        }
        (*xmlFree)(buf->contentIO);
      }
      else {
        __dest = (xmlChar *)(*xmlRealloc)(buf->content,(size_t)uVar3);
        if (__dest == (xmlChar *)0x0) {
          return -1;
        }
      }
      if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        buf->contentIO = __dest;
      }
      buf->content = __dest;
      buf->size = uVar3;
      iVar2 = ~buf->use + uVar3;
    }
    else {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int
xmlBufferGrow(xmlBufferPtr buf, unsigned int len) {
    unsigned int size;
    xmlChar *newbuf;

    if (buf == NULL)
        return(-1);

    if (len < buf->size - buf->use)
        return(0);
    if (len >= INT_MAX - buf->use)
        return(-1);

    if (buf->size > (size_t) len) {
        if (buf->size <= INT_MAX / 2)
            size = buf->size * 2;
        else
            size = INT_MAX;
    } else {
        size = buf->use + len + 1;
        if (size <= INT_MAX - 100)
            size += 100;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->content != buf->contentIO)) {
        newbuf = xmlMalloc(size);
        if (newbuf == NULL)
            return(-1);
        if (buf->content != NULL)
            memcpy(newbuf, buf->content, buf->use + 1);
        xmlFree(buf->contentIO);
    } else {
        newbuf = xmlRealloc(buf->content, size);
        if (newbuf == NULL)
            return(-1);
    }

    if (buf->alloc == XML_BUFFER_ALLOC_IO)
        buf->contentIO = newbuf;
    buf->content = newbuf;
    buf->size = size;

    return(buf->size - buf->use - 1);
}